

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution.hpp
# Opt level: O2

ostream * operator<<(ostream *out,SpecificSolution *spec)

{
  runtime_error *this;
  
  if ((ulong)*spec < 3) {
    std::operator<<(out,&DAT_0011288c + *(int *)(&DAT_0011288c + (ulong)*spec * 4));
    return out;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Unexpected SpecificSolution found");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::ostream &operator<<(std::ostream &out, const SpecificSolution &spec) {
    switch (spec) {
        case SpecificSolution::kNoRoots:
            out << "no roots";
            break;
        case SpecificSolution::kAnyNumberIsRoot:
            out << "any number";
            break;
        case SpecificSolution::kCannotSolve:
            out << "cannot solve";
            break;
        default:
            throw std::runtime_error("Unexpected SpecificSolution found");
    }
    return out;
}